

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool array_container_contains(array_container_t *arr,uint16_t pos)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  
  uVar2 = 0;
  uVar3 = arr->cardinality;
  do {
    iVar5 = uVar2 + 0x10;
    while( true ) {
      if ((int)uVar3 <= iVar5) {
        if ((int)uVar3 <= (int)uVar2) {
          return false;
        }
        uVar4 = (ulong)uVar2;
        while( true ) {
          uVar1 = arr->array[uVar4];
          bVar8 = uVar1 == pos;
          if (bVar8) {
            return bVar8;
          }
          if (pos <= uVar1 && !bVar8) break;
          iVar5 = (int)uVar4;
          uVar4 = uVar4 + 1;
          if (uVar3 - 1 == iVar5) {
            return bVar8;
          }
        }
        return bVar8;
      }
      uVar7 = uVar2 + (uVar3 - 1);
      uVar6 = uVar7 >> 1;
      uVar1 = *(ushort *)((long)arr->array + (ulong)(uVar7 & 0xfffffffe));
      if (pos <= uVar1) break;
      uVar2 = uVar6 + 1;
      iVar5 = uVar6 + 0x11;
    }
    uVar3 = uVar6;
  } while (pos < uVar1);
  return true;
}

Assistant:

inline bool array_container_contains(const array_container_t *arr,
                                     uint16_t pos) {
    //    return binarySearch(arr->array, arr->cardinality, pos) >= 0;
    // binary search with fallback to linear search for short ranges
    int32_t low = 0;
    const uint16_t * carr = (const uint16_t *) arr->array;
    int32_t high = arr->cardinality - 1;
    //    while (high - low >= 0) {
    while(high >= low + 16) {
        int32_t middleIndex = (low + high)>>1;
        uint16_t middleValue = carr[middleIndex];
        if (middleValue < pos) {
            low = middleIndex + 1;
        } else if (middleValue > pos) {
            high = middleIndex - 1;
        } else {
            return true;
        }
    }

    for (int i=low; i <= high; i++) {
        uint16_t v = carr[i];
        if (v == pos) {
            return true;
        }
        if ( v > pos ) return false;
    }
    return false;

}